

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::RangeListSyntax::setChild(RangeListSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 2) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->closeBrace).kind = TVar4.kind;
    (this->closeBrace).field_0x2 = TVar4._2_1_;
    (this->closeBrace).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->closeBrace).rawLen = TVar4.rawLen;
    (this->closeBrace).info = TVar4.info;
  }
  else if (index == 1) {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->valueRanges).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->valueRanges).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->valueRanges).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->valueRanges).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->valueRanges).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->valueRanges).elements._M_ptr = (pointer)pSVar3[1].parent;
    (this->valueRanges).elements._M_extent._M_extent_value = (size_t)pSVar1;
  }
  else {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->openBrace).kind = TVar4.kind;
    (this->openBrace).field_0x2 = TVar4._2_1_;
    (this->openBrace).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->openBrace).rawLen = TVar4.rawLen;
    (this->openBrace).info = TVar4.info;
  }
  return;
}

Assistant:

void RangeListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openBrace = child.token(); return;
        case 1: valueRanges = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 2: closeBrace = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}